

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void lower_bound_sorted_suite::find_odd_first_predicate(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  array<int,_5UL> storage;
  int *local_38;
  int *local_30;
  int local_28 [6];
  
  local_30 = local_28;
  local_28[0] = 0x37;
  local_28[1] = 0x2c;
  local_28[2] = 0x21;
  local_28[3] = 0x16;
  local_28[4] = 0xb;
  lVar1 = 5;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (local_30[lVar2] < 0x39) {
      lVar3 = 0;
    }
    local_30 = local_30 + lVar3;
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  local_30 = local_30 + (0x38 < *local_30);
  piVar4 = local_28;
  local_38 = piVar4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 56, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x409,"void lower_bound_sorted_suite::find_odd_first_predicate()",&local_30,&local_38)
  ;
  lVar1 = 5;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (piVar4[lVar2] < 0x38) {
      lVar3 = 0;
    }
    piVar4 = piVar4 + lVar3;
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  local_30 = piVar4 + (0x37 < *piVar4);
  piVar4 = local_28;
  local_38 = piVar4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 55, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x40b,"void lower_bound_sorted_suite::find_odd_first_predicate()",&local_30,&local_38)
  ;
  lVar1 = 5;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (piVar4[lVar2] < 0x37) {
      lVar3 = 0;
    }
    piVar4 = piVar4 + lVar3;
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  local_30 = piVar4 + (0x36 < *piVar4);
  local_38 = local_28 + 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 54, std::greater<int>{})",
             "std::next(storage.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x40d,"void lower_bound_sorted_suite::find_odd_first_predicate()",&local_30,&local_38)
  ;
  return;
}

Assistant:

void find_odd_first_predicate()
{
    std::array<int, 5> storage = { 55, 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 56, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 55, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 54, std::greater<int>{}),
                  std::next(storage.begin(), 1));
}